

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O1

void OpenMD::Utils::details::lifted_deleter<OpenMD::CutoffGroup*>(CutoffGroup *val)

{
  pointer ppAVar1;
  
  if (val != (CutoffGroup *)0x0) {
    ppAVar1 = (val->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar1 != (pointer)0x0) {
      operator_delete(ppAVar1,(long)(val->cutoffAtomList).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppAVar1);
    }
    operator_delete(val,0x40);
    return;
  }
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }